

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O0

void fdump_dfg_config_action(FILE *out,EVdfg_config_action act)

{
  FILE *in_RDI;
  undefined4 in_stack_00000008;
  uint in_stack_0000000c;
  uint in_stack_00000018;
  uint in_stack_0000001c;
  
  switch(in_stack_00000008) {
  case 0:
    fprintf(in_RDI,"Action is NO_OP\n");
    break;
  case 1:
    fprintf(in_RDI,"Action is CREATE_STONE, stone_id = %x, action %s\n",(ulong)in_stack_0000000c,
            CONCAT44(in_stack_0000001c,in_stack_00000018));
    break;
  case 2:
    fprintf(in_RDI,"Action is ADD_ACTION, stone_id = %x, action %s\n",(ulong)in_stack_0000000c,
            CONCAT44(in_stack_0000001c,in_stack_00000018));
    break;
  case 3:
    fprintf(in_RDI,"Action is SET_AUTO_PERIOD, stone_id = %x, secs %d, usecs %d\n",
            (ulong)in_stack_0000000c,(ulong)in_stack_00000018,(ulong)in_stack_0000001c);
    break;
  case 4:
    fprintf(in_RDI,"Action is LINK_PORT, src_stone_id = %x, port %d, dest_stone_id %x\n",
            (ulong)in_stack_0000000c,(ulong)in_stack_00000018,(ulong)in_stack_0000001c);
    break;
  case 5:
    fprintf(in_RDI,"Action is LINK_DEST, src_stone_id = %x, dest_stone_id %x\n",
            (ulong)in_stack_0000000c,(ulong)in_stack_0000001c);
    break;
  case 6:
    fprintf(in_RDI,"Action is UNLINK_PORT, src_stone_id = %x, port %d\n",(ulong)in_stack_0000000c,
            (ulong)in_stack_00000018);
    break;
  case 7:
    fprintf(in_RDI,"Action is UNLINK_DEST, src_stone_id = %x, dest %x\n",(ulong)in_stack_0000000c,
            (ulong)in_stack_0000001c);
    break;
  case 8:
    fprintf(in_RDI,"Action is SET_ATTRS, stone_id = %x, attrs ",(ulong)in_stack_0000000c);
    fdump_attr_list(in_RDI,CONCAT44(in_stack_0000001c,in_stack_00000018));
    break;
  case 9:
    fprintf(in_RDI,"Action is DESTROY, stone_id = %x\n",(ulong)in_stack_0000000c);
    break;
  case 10:
    fprintf(in_RDI,"Action is FREEZE, stone_id = %x\n",(ulong)in_stack_0000000c);
    break;
  case 0xb:
    fprintf(in_RDI,"Action is UNFREEZE, stone_id = %x\n",(ulong)in_stack_0000000c);
    break;
  case 0xc:
    fprintf(in_RDI,"Action is ASSIGN_NODE, stone_id = %x, node = %d\n",(ulong)in_stack_0000000c,
            (ulong)in_stack_00000018);
    break;
  case 0xd:
    fprintf(in_RDI,"Action is CREATE_BRIDGE, stone_id = %x, target %x, action %s\n",
            (ulong)in_stack_0000000c,(ulong)act.type,CONCAT44(in_stack_0000001c,in_stack_00000018));
  }
  return;
}

Assistant:

static void
fdump_dfg_config_action(FILE *out, EVdfg_config_action act)
{
    switch(act.type) {
    case ACT_no_op:
	fprintf(out, "Action is NO_OP\n");
	break;
    case ACT_create_bridge:
	fprintf(out, "Action is CREATE_BRIDGE, stone_id = %x, target %x, action %s\n",
		act.stone_id, act.u.bridge.target_id, act.u.bridge.action);
	break;
    case ACT_create:
	fprintf(out, "Action is CREATE_STONE, stone_id = %x, action %s\n",
		act.stone_id, act.u.create.action);
	break;
    case ACT_add_action:
	fprintf(out, "Action is ADD_ACTION, stone_id = %x, action %s\n",
		act.stone_id, act.u.create.action);
	break;
    case ACT_set_auto_period:
	fprintf(out, "Action is SET_AUTO_PERIOD, stone_id = %x, secs %d, usecs %d\n",
		act.stone_id, act.u.period.secs, act.u.period.usecs);
	break;
    case ACT_link_port:
	fprintf(out, "Action is LINK_PORT, src_stone_id = %x, port %d, dest_stone_id %x\n",
		act.stone_id, act.u.link.port, act.u.link.dest_id);
	break;
    case ACT_link_dest:
	fprintf(out, "Action is LINK_DEST, src_stone_id = %x, dest_stone_id %x\n",
		act.stone_id, act.u.link.dest_id);
	break;
    case ACT_unlink_port:
	fprintf(out, "Action is UNLINK_PORT, src_stone_id = %x, port %d\n",
		act.stone_id, act.u.link.port);
	break;
    case ACT_unlink_dest:
	fprintf(out, "Action is UNLINK_DEST, src_stone_id = %x, dest %x\n",
		act.stone_id, act.u.link.dest_id);
	break;
    case ACT_set_attrs: 
	fprintf(out, "Action is SET_ATTRS, stone_id = %x, attrs ",
		act.stone_id);
	fdump_attr_list(out, act.u.attrs.attrs);
	break;
    case ACT_assign_node:
	fprintf(out, "Action is ASSIGN_NODE, stone_id = %x, node = %d\n",
		act.stone_id, act.u.assign.dest_node);
	break;
    case ACT_destroy:
	fprintf(out, "Action is DESTROY, stone_id = %x\n",
		act.stone_id);
	break;
    case ACT_freeze:
	fprintf(out, "Action is FREEZE, stone_id = %x\n",
		act.stone_id);
	break;
    case ACT_unfreeze:
	fprintf(out, "Action is UNFREEZE, stone_id = %x\n",
		act.stone_id);
	break;
    }
}